

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int udp_ep_set_recvmaxsz(void *arg,void *v,size_t sz,nni_opt_type t)

{
  nni_mtx *mtx;
  int iVar1;
  size_t local_20;
  size_t val;
  
  iVar1 = nni_copyin_size(&local_20,v,sz,0,65000,t);
  if (iVar1 == 0) {
    if (local_20 - 0xfde9 < 0xffffffffffff0218) {
      local_20 = 65000;
    }
    mtx = (nni_mtx *)((long)arg + 8);
    nni_mtx_lock(mtx);
    if (*(char *)((long)arg + 0x35) == '\x01') {
      nni_mtx_unlock(mtx);
      iVar1 = 4;
    }
    else {
      *(undefined2 *)((long)arg + 0xa30) = (undefined2)local_20;
      nni_mtx_unlock(mtx);
      nni_stat_set_value((nni_stat_item *)((long)arg + 0xa78),local_20);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
udp_ep_set_recvmaxsz(void *arg, const void *v, size_t sz, nni_opt_type t)
{
	udp_ep *ep = arg;
	size_t  val;
	int     rv;
	if ((rv = nni_copyin_size(&val, v, sz, 0, 65000, t)) == 0) {
		if ((val == 0) || (val > 65000)) {
			val = 65000;
		}
		nni_mtx_lock(&ep->mtx);
		if (ep->started) {
			nni_mtx_unlock(&ep->mtx);
			return (NNG_EBUSY);
		}
		ep->rcvmax = (uint16_t) val;
		nni_mtx_unlock(&ep->mtx);
		nni_stat_set_value(&ep->st_rcv_max, val);
	}
	return (rv);
}